

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrUtil.c
# Opt level: O0

void Rwr_ManLoadFromArray(Rwr_Man_t *p,int fVerbose)

{
  ushort uVar1;
  ushort uVar2;
  uint fExor_00;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Rwr_Node_t *pRVar6;
  Rwr_Node_t *pRVar7;
  abctime aVar8;
  abctime clk;
  int i;
  int fExor;
  int nEntries;
  int Volume;
  int Level;
  uint Entry1;
  uint Entry0;
  Rwr_Node_t *p1;
  Rwr_Node_t *p0;
  unsigned_short *pArray;
  int fVerbose_local;
  Rwr_Man_t *p_local;
  
  aVar5 = Abc_Clock();
  clk._4_4_ = 0;
  while( true ) {
    uVar1 = s_RwtAigSubgraphs[clk._4_4_ << 1];
    uVar2 = s_RwtAigSubgraphs[clk._4_4_ * 2 + 1];
    if ((uVar1 == 0) && (uVar2 == 0)) break;
    fExor_00 = uVar1 & 1;
    pRVar6 = (Rwr_Node_t *)p->vForest->pArray[uVar1 >> 2];
    pRVar7 = (Rwr_Node_t *)p->vForest->pArray[uVar2 >> 1];
    iVar3 = Abc_MaxInt(*(uint *)&pRVar6->field_0xe >> 0x18 & 0x3f,
                       *(uint *)&pRVar7->field_0xe >> 0x18 & 0x3f);
    iVar4 = Rwr_ManNodeVolume(p,pRVar6,pRVar7);
    pRVar6 = Rwr_NotCond(pRVar6,uVar1 >> 1 & 1);
    pRVar7 = Rwr_NotCond(pRVar7,uVar2 & 1);
    Rwr_ManAddNode(p,pRVar6,pRVar7,fExor_00,iVar3 + 1,iVar4 + 1 + fExor_00);
    clk._4_4_ = clk._4_4_ + 1;
  }
  if (fVerbose != 0) {
    printf("The number of classes = %d. Canonical nodes = %d.\n",(ulong)(uint)p->nClasses,
           (ulong)(uint)p->nAdded);
    printf("The number of nodes loaded = %d.  ",(ulong)(clk._4_4_ - 1));
    Abc_Print(1,"%s =","Loading");
    aVar8 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar8 - aVar5) * 1.0) / 1000000.0);
  }
  return;
}

Assistant:

void Rwr_ManLoadFromArray( Rwr_Man_t * p, int fVerbose )
{
    unsigned short * pArray = s_RwtAigSubgraphs;
    Rwr_Node_t * p0, * p1;
    unsigned Entry0, Entry1;
    int Level, Volume, nEntries, fExor;
    int i;
    abctime clk = Abc_Clock();

    // reconstruct the forest
    for ( i = 0; ; i++ )
    {
        Entry0 = pArray[2*i + 0];
        Entry1 = pArray[2*i + 1];
        if ( Entry0 == 0 && Entry1 == 0 )
            break;
        // get EXOR flag
        fExor = (Entry0 & 1);
        Entry0 >>= 1;
        // get the nodes
        p0 = (Rwr_Node_t *)p->vForest->pArray[Entry0 >> 1];
        p1 = (Rwr_Node_t *)p->vForest->pArray[Entry1 >> 1];
        // compute the level and volume of the new nodes
        Level  = 1 + Abc_MaxInt( p0->Level, p1->Level );
        Volume = 1 + Rwr_ManNodeVolume( p, p0, p1 );
        // set the complemented attributes
        p0 = Rwr_NotCond( p0, (Entry0 & 1) );
        p1 = Rwr_NotCond( p1, (Entry1 & 1) );
        // add the node
//        Rwr_ManTryNode( p, p0, p1, Level, Volume );
        Rwr_ManAddNode( p, p0, p1, fExor, Level, Volume + fExor );
    }
    nEntries = i - 1;
    if ( fVerbose )
    {
        printf( "The number of classes = %d. Canonical nodes = %d.\n", p->nClasses, p->nAdded );
        printf( "The number of nodes loaded = %d.  ", nEntries );  ABC_PRT( "Loading", Abc_Clock() - clk );
    }
}